

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O0

size_t GetEncodingCharSize(char *encoding)

{
  int iVar1;
  char *encoding_local;
  
  iVar1 = strncasecmp(encoding,"UCS-2",5);
  if ((iVar1 == 0) || (iVar1 = strncasecmp(encoding,"UTF-16",6), iVar1 == 0)) {
    return 2;
  }
  iVar1 = strncasecmp(encoding,"UCS-4",5);
  if ((iVar1 != 0) && (iVar1 = strncasecmp(encoding,"UTF-32",6), iVar1 != 0)) {
    return 1;
  }
  return 4;
}

Assistant:

static size_t GetEncodingCharSize(const char* encoding)
{
	if (! strnicmp(encoding, "UCS-2", 5) || ! strnicmp(encoding, "UTF-16", 6))
		return sizeof(UINT16);
	else if (! strnicmp(encoding, "UCS-4", 5) || ! strnicmp(encoding, "UTF-32", 6))
		return sizeof(UINT32);
	else
		return sizeof(char);
}